

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O1

void nn_mutex_init(nn_mutex_t *self)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  __init_routine *__init_routine;
  pthread_mutex_t *ppVar3;
  pthread_once_t *__once_control;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_14;
  
  pthread_mutexattr_init(&local_14);
  __init_routine = (__init_routine *)0x2;
  iVar1 = pthread_mutexattr_settype(&local_14,2);
  if (iVar1 == 0) {
    __init_routine = (__init_routine *)0x0;
    uVar2 = pthread_mutex_init((pthread_mutex_t *)self,(pthread_mutexattr_t *)0x0);
    if (uVar2 == 0) {
      pthread_mutexattr_destroy(&local_14);
      return;
    }
  }
  else {
    nn_mutex_init_cold_1();
    uVar2 = extraout_EAX;
  }
  ppVar3 = (pthread_mutex_t *)(ulong)uVar2;
  nn_mutex_init_cold_2();
  uVar2 = pthread_mutex_destroy(ppVar3);
  if (uVar2 == 0) {
    return;
  }
  ppVar3 = (pthread_mutex_t *)(ulong)uVar2;
  nn_mutex_term_cold_1();
  uVar2 = pthread_mutex_lock(ppVar3);
  if (uVar2 == 0) {
    return;
  }
  ppVar3 = (pthread_mutex_t *)(ulong)uVar2;
  nn_mutex_lock_cold_1();
  uVar2 = pthread_mutex_unlock(ppVar3);
  if (uVar2 == 0) {
    return;
  }
  __once_control = (pthread_once_t *)(ulong)uVar2;
  nn_mutex_unlock_cold_1();
  pthread_once(__once_control,__init_routine);
  return;
}

Assistant:

void nn_mutex_init (nn_mutex_t *self)
{
    int rc;
    pthread_mutexattr_t attr;

    pthread_mutexattr_init(&attr);
    rc = pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_ERRORCHECK);
    errnum_assert (rc == 0, rc);
    rc = pthread_mutex_init (&self->mutex, NULL);
    errnum_assert (rc == 0, rc);
    pthread_mutexattr_destroy(&attr);
}